

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_apbe.c
# Opt level: O1

void gga_k_apbe_init(xc_func_type *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  double *pdVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long extraout_RDX;
  long in_RSI;
  long *plVar11;
  long *in_R8;
  long lVar12;
  ulong uVar13;
  undefined8 uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  plVar11 = (long *)0x20;
  puVar7 = (undefined8 *)malloc(0x20);
  p->params = puVar7;
  uVar4 = p->info->number;
  uVar9 = (ulong)uVar4;
  if (uVar4 == 0x36) {
    uVar14 = 0x3fe9ba5e353f7cee;
  }
  else {
    if (uVar4 != 0x35) {
      gga_k_apbe_init_cold_1();
      if (in_RSI != 0) {
        lVar6 = plVar11[1];
        lVar12 = 0;
        do {
          if ((int)lVar6 == 2) {
            lVar8 = (int)plVar11[9] * lVar12;
            dVar15 = *(double *)(extraout_RDX + lVar8 * 8) +
                     *(double *)(extraout_RDX + 8 + lVar8 * 8);
          }
          else {
            dVar15 = *(double *)(extraout_RDX + (int)plVar11[9] * lVar12 * 8);
          }
          dVar20 = (double)plVar11[0x30];
          if (dVar20 <= dVar15) {
            dVar15 = *(double *)(extraout_RDX + (int)plVar11[9] * lVar12 * 8);
            if (dVar15 <= dVar20) {
              dVar15 = dVar20;
            }
            dVar19 = 0.0;
            if (dVar20 < dVar15 * 0.5) {
              dVar20 = (double)plVar11[0x31];
              dVar19 = (double)(-(ulong)(dVar20 < 1.0) & 0x3ff0000000000000 |
                               ~-(ulong)(dVar20 < 1.0) & (ulong)(dVar20 + -1.0 + 1.0));
              uVar13 = -(ulong)(dVar19 <= dVar20);
              dVar19 = (double)(uVar13 & (ulong)dVar20 | ~uVar13 & (ulong)dVar19);
              dVar16 = cbrt(dVar19);
              pdVar5 = (double *)plVar11[0x2f];
              dVar17 = (double)plVar11[0x32] * (double)plVar11[0x32];
              dVar20 = *(double *)(uVar9 + *(int *)((long)plVar11 + 0x4c) * lVar12 * 8);
              if (dVar20 <= dVar17) {
                dVar20 = dVar17;
              }
              dVar17 = pdVar5[3];
              dVar1 = pdVar5[2];
              dVar2 = *pdVar5;
              dVar3 = pdVar5[1];
              dVar18 = cbrt(9.869604401089358);
              dVar21 = 1.0 / (dVar18 * dVar18);
              dVar18 = cbrt(dVar15);
              dVar15 = (1.0 / (dVar18 * dVar18)) / (dVar15 * dVar15);
              dVar22 = dVar20 * 1.5874010519681996 * dVar15;
              dVar19 = dVar18 * dVar18 * dVar16 * dVar16 * dVar19 * 1.4356170000940958 *
                       ((1.0 - dVar2 / (((((1.0 / ((dVar3 * 1.8171205928321397 * dVar21 * dVar22) /
                                                   24.0 + 1.0)) * dVar15 *
                                          dVar21 * 1.8171205928321397 * (dVar1 - dVar17) * dVar3 *
                                          dVar20 * 1.5874010519681996) / 24.0 + dVar17) *
                                         1.8171205928321397 * dVar21 * dVar22) / 24.0 + dVar2)) *
                        dVar2 + 1.0);
              dVar19 = dVar19 + dVar19;
            }
            lVar8 = *in_R8;
            if ((lVar8 != 0) && ((*(byte *)(*plVar11 + 0x40) & 1) != 0)) {
              lVar10 = (int)plVar11[0xb] * lVar12;
              *(double *)(lVar8 + lVar10 * 8) = dVar19 + *(double *)(lVar8 + lVar10 * 8);
            }
          }
          lVar12 = lVar12 + 1;
        } while (in_RSI != lVar12);
      }
      return;
    }
    uVar14 = 0x3ff3eb851eb851ec;
  }
  *puVar7 = uVar14;
  puVar7[1] = 0x3ffaaaaaaaaaaaab;
  puVar7[2] = 0x3fce97396d0917d7;
  puVar7[3] = 0x3fc7b425ed097b42;
  return;
}

Assistant:

static void
gga_k_apbe_init(xc_func_type *p)
{
  gga_k_apbe_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_apbe_params));
  params = (gga_k_apbe_params *) (p->params);

  params->lambda = 0.0;

  switch(p->info->number){
  case XC_GGA_K_APBE:
    params->kappa = 0.8040;
    params->mu    = 0.23889;
    break;
  case XC_GGA_K_TW1:
    params->kappa = 0.8209;
    params->mu    = 0.2335;
    break;
  case XC_GGA_K_TW2:
    params->kappa = 0.6774;
    params->mu    = 0.2371;
    break;
  case XC_GGA_K_TW3:
    params->kappa = 0.8438;
    params->mu    = 0.2319;
    break;
  case XC_GGA_K_TW4:
    params->kappa = 0.8589;
    params->mu    = 0.2309;
    break;
  case XC_GGA_K_REVAPBE:
    params->kappa = 1.245;
    params->mu    = 0.23889;
    break;
  default:
    fprintf(stderr, "Internal error in gga_k_apbe\n");
    exit(1);
  }
}